

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

bool __thiscall SQVM::Return<false>(SQVM *this,SQInteger _arg0,SQInteger _arg1,SQObjectPtr *retval)

{
  CallInfo *pCVar1;
  SQBool SVar2;
  
  pCVar1 = this->ci;
  SVar2 = pCVar1->_root;
  if ((SVar2 != 0) ||
     (((long)pCVar1->_target != -1 &&
      (retval = (this->_stack)._vals +
                (this->_stackbase - (long)pCVar1->_prevstkbase) + (long)pCVar1->_target,
      retval != (SQObjectPtr *)0x0)))) {
    if (_arg0 == 0xff) {
      SQObjectPtr::Null(retval);
    }
    else {
      SQObjectPtr::operator=(retval,(this->_stack)._vals + this->_stackbase + _arg1);
    }
  }
  LeaveFrame(this);
  return SVar2 != 0;
}

Assistant:

bool SQVM::Return(SQInteger _arg0, SQInteger _arg1, SQObjectPtr &retval)
{
    SQBool    _isroot      = ci->_root;
    SQInteger callerbase   = _stackbase - ci->_prevstkbase;
    if constexpr (debughookPresent)
    {
        if (_debughook) {
            for(SQInteger i=0; i<ci->_ncalls; i++) {
                CallDebugHook(_SC('r'));
            }
        }
    }

    SQObjectPtr *dest;
    if (_isroot) {
        dest = &(retval);
    } else if (ci->_target == -1) {
        dest = NULL;
    } else {
        dest = &_stack._vals[callerbase + ci->_target];
    }
    if (dest) {
        if(_arg0 != 0xFF) {
            *dest = _stack._vals[_stackbase+_arg1];
        }
        else {
            dest->Null();
        }
        //*dest = (_arg0 != 0xFF) ? _stack._vals[_stackbase+_arg1] : _null_;
    }
    LeaveFrame();
    return _isroot ? true : false;
}